

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                   *this,arrays_type *new_arrays_)

{
  arrays_type *arrays_;
  size_t sVar1;
  value_type_pointer pbVar2;
  size_t sVar3;
  size_t num_destroyed;
  undefined8 local_38;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  *local_30;
  arrays_type *local_28;
  undefined1 *local_20;
  
  local_20 = (undefined1 *)&local_38;
  local_38 = 0;
  arrays_ = &this->arrays;
  local_30 = this;
  local_28 = new_arrays_;
  for_all_elements_while<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____external_boost_unordered_hpp:6916:41)>
            (arrays_,(anon_class_24_3_45a051ed *)&local_30);
  delete_arrays(this,arrays_);
  sVar3 = new_arrays_->groups_size_index;
  sVar1 = new_arrays_->groups_size_mask;
  pbVar2 = new_arrays_->elements_;
  (this->arrays).groups_ = new_arrays_->groups_;
  (this->arrays).elements_ = pbVar2;
  arrays_->groups_size_index = sVar3;
  (this->arrays).groups_size_mask = sVar1;
  sVar3 = initial_max_load(this);
  (this->size_ctrl).ml = sVar3;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }